

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfcc.hpp
# Opt level: O3

Mat_<double> *
mel_spectrogram_create(Mat_<double> *__return_storage_ptr__,int nps,int n_fft,int n_mels)

{
  long *plVar1;
  uint length;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  Mat_<double> mel_f;
  Mat_<double> ramps;
  Mat_<double> enorm;
  Mat_<double> fdiff;
  Mat_<double> lower;
  Mat_<double> fftfreqs;
  Mat_<double> upper;
  Mat_<double> ramps_2;
  Mat_<double> ramps_1;
  Mat weights_1;
  Mat_<double> d2;
  Mat_<double> d1;
  Mat_<double> mels;
  Mat m;
  ulong local_8b0;
  long local_890;
  undefined8 local_870;
  _OutputArray local_868;
  _InputArray local_850;
  undefined1 local_838 [96];
  Mat local_7d8 [12];
  int local_7cc;
  long local_7c8;
  long *local_790;
  long *local_778;
  undefined8 uStack_770;
  long local_768 [12];
  Mat local_708 [96];
  Mat local_6a8 [152];
  Mat_<double> local_610;
  uint local_5b0 [3];
  int local_5a4;
  Mat_<double> local_550;
  uint local_4f0 [24];
  _InputArray local_490 [4];
  Mat local_430 [16];
  long local_420;
  Mat local_3d0 [16];
  long local_3c0;
  Mat local_370 [16];
  long local_360;
  Mat local_310 [96];
  Mat local_2b0 [96];
  Mat_<double> local_250;
  Mat_<double> local_1f0;
  Mat local_190 [16];
  Mat local_180 [96];
  Mat local_120 [96];
  Mat aMStack_c0 [144];
  
  uVar6 = (ulong)(uint)n_mels;
  length = n_fft / 2 + 1;
  cv::Mat::Mat(&__return_storage_ptr__->super_Mat,n_mels,length,6);
  local_768[0] = 0;
  local_768[1] = 0;
  local_778 = (long *)0x0;
  uStack_770 = 0;
  cv::Mat::operator=(&__return_storage_ptr__->super_Mat,(Scalar_ *)&local_778);
  dVar7 = (double)nps * 0.5;
  cvlinspace(&local_550,0.0,dVar7,length);
  if (1000.0 <= dVar7) {
    dVar7 = log(dVar7 / 1000.0);
    dVar7 = dVar7 / 0.06875177742094912 + 14.999999999999998;
  }
  else {
    dVar7 = dVar7 / 66.66666666666667;
  }
  cvlinspace(&local_1f0,0.0,dVar7,n_mels + 2);
  cv::Mat::Mat(&local_250.super_Mat,&local_1f0.super_Mat);
  mel_to_hz((Mat_<double> *)local_838,&local_250,false);
  cv::Mat::~Mat(&local_250.super_Mat);
  cv::Mat::Mat(local_2b0,1,local_838._8_4_ * local_838._12_4_ + -1,6,(void *)(local_838._16_8_ + 8),
               0);
  cv::Mat::Mat(local_310,1,local_838._8_4_ * local_838._12_4_ + -1,6,(void *)local_838._16_8_,0);
  cv::operator-((Mat *)&local_778,local_2b0);
  cv::Mat::Mat(&local_610.super_Mat);
  local_610._0_4_ = local_610._0_4_ & 0xfffff000 | 6;
  cv::Mat::Mat(local_190);
  (**(code **)(*local_778 + 0x18))(local_778,&local_778,local_190,0xffffffff);
  cv::Mat_<double>::operator=(&local_610,local_190);
  cv::Mat::~Mat(local_190);
  cv::Mat::~Mat(local_6a8);
  cv::Mat::~Mat(local_708);
  cv::Mat::~Mat((Mat *)local_768);
  cv::Mat::Mat(local_7d8,local_838._12_4_,local_550._12_4_,6);
  if (0 < (long)(int)local_838._12_4_) {
    lVar4 = 0;
    do {
      if (0 < (int)local_550._12_4_) {
        lVar2 = *local_790;
        uVar5 = 0;
        do {
          *(double *)(lVar2 * lVar4 + local_7c8 + uVar5 * 8) =
               *(double *)(local_838._16_8_ + lVar4 * 8) - *(double *)(local_550._16_8_ + uVar5 * 8)
          ;
          uVar5 = uVar5 + 1;
        } while ((uint)local_550._12_4_ != uVar5);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != (int)local_838._12_4_);
  }
  if (0 < n_mels) {
    local_890 = 2;
    local_8b0 = 0;
    do {
      cv::Mat::Mat(local_3d0,1,local_7cc,6);
      if (0 < (long)local_7cc) {
        lVar4 = *local_790;
        lVar2 = 0;
        do {
          *(undefined8 *)(local_3c0 + lVar2 * 8) =
               *(undefined8 *)(lVar4 * local_8b0 + local_7c8 + lVar2 * 8);
          lVar2 = lVar2 + 1;
        } while (local_7cc != lVar2);
      }
      cv::Mat::Mat(local_430,1,local_7cc,6);
      if (0 < (long)local_7cc) {
        lVar4 = *local_790;
        lVar2 = 0;
        do {
          *(undefined8 *)(local_420 + lVar2 * 8) =
               *(undefined8 *)(lVar4 * local_890 + local_7c8 + lVar2 * 8);
          lVar2 = lVar2 + 1;
        } while (local_7cc != lVar2);
      }
      cv::operator*(local_190,-1.0);
      cv::operator/((MatExpr *)&local_778,*(double *)(local_610._16_8_ + local_8b0 * 8));
      cv::Mat::Mat((Mat *)local_5b0);
      local_5b0[0] = local_5b0[0] & 0xfffff000 | 6;
      cv::Mat::Mat((Mat *)local_4f0);
      (**(code **)(*local_778 + 0x18))(local_778,(MatExpr *)&local_778,(Mat *)local_4f0,0xffffffff);
      cv::Mat_<double>::operator=((Mat_<double> *)local_5b0,(Mat *)local_4f0);
      cv::Mat::~Mat((Mat *)local_4f0);
      cv::Mat::~Mat(local_6a8);
      cv::Mat::~Mat(local_708);
      cv::Mat::~Mat((Mat *)local_768);
      cv::Mat::~Mat(aMStack_c0);
      cv::Mat::~Mat(local_120);
      cv::Mat::~Mat(local_180);
      cv::operator/((Mat *)&local_778,*(double *)(local_610._16_8_ + 8 + local_8b0 * 8));
      cv::Mat::Mat((Mat *)local_4f0);
      local_4f0[0] = local_4f0[0] & 0xfffff000 | 6;
      cv::Mat::Mat(local_190);
      (**(code **)(*local_778 + 0x18))(local_778,(Mat *)&local_778,local_190,0xffffffff);
      cv::Mat_<double>::operator=((Mat_<double> *)local_4f0,local_190);
      cv::Mat::~Mat(local_190);
      cv::Mat::~Mat(local_6a8);
      cv::Mat::~Mat(local_708);
      cv::Mat::~Mat((Mat *)local_768);
      cv::Mat::Mat((Mat *)&local_778,(Mat *)local_5b0);
      cv::Mat::Mat(local_190,(Mat *)local_4f0);
      cv::Mat::Mat((Mat *)local_490,1,local_5a4,6);
      cv::Mat::Mat(local_370,(Mat *)local_490);
      cv::Mat::~Mat((Mat *)local_490);
      cv::min((Mat *)&local_778,local_190,local_370);
      local_490[0].sz.width = 0;
      local_490[0].sz.height = 0;
      local_490[0].flags = 0x1010000;
      local_870 = 0;
      local_850.flags = -0x3efdfffa;
      local_850.obj = &local_870;
      local_850.sz.width = 1;
      local_850.sz.height = 1;
      local_868.super__InputArray.sz.width = 0;
      local_868.super__InputArray.sz.height = 0;
      local_868.super__InputArray.flags = 0x2010000;
      local_868.super__InputArray.obj = local_370;
      local_490[0].obj = local_370;
      cv::max(local_490,&local_850,&local_868);
      if (-2 < n_fft) {
        lVar4 = **(long **)&__return_storage_ptr__->field_0x48;
        lVar2 = *(long *)&__return_storage_ptr__->field_0x10;
        uVar5 = 0;
        do {
          *(undefined8 *)(lVar4 * local_8b0 + lVar2 + uVar5 * 8) =
               *(undefined8 *)(local_360 + uVar5 * 8);
          uVar5 = uVar5 + 1;
        } while (length != uVar5);
      }
      local_8b0 = local_8b0 + 1;
      cv::Mat::~Mat(local_370);
      cv::Mat::~Mat(local_190);
      cv::Mat::~Mat((Mat *)&local_778);
      cv::Mat::~Mat((Mat *)local_4f0);
      cv::Mat::~Mat((Mat *)local_5b0);
      cv::Mat::~Mat(local_430);
      cv::Mat::~Mat(local_3d0);
      local_890 = local_890 + 1;
    } while (local_8b0 != uVar6);
  }
  cv::Mat::Mat((Mat *)&local_778,1,n_mels,6);
  if (0 < n_mels) {
    uVar5 = 0;
    do {
      *(double *)(local_768[0] + uVar5 * 8) =
           2.0 / (*(double *)(local_838._16_8_ + uVar5 * 8 + 0x10) -
                 *(double *)(local_838._16_8_ + uVar5 * 8));
      uVar5 = uVar5 + 1;
    } while (uVar6 != uVar5);
    if (0 < n_mels) {
      lVar4 = *(long *)&__return_storage_ptr__->field_0x10;
      plVar1 = *(long **)&__return_storage_ptr__->field_0x48;
      uVar5 = 0;
      do {
        if (-2 < n_fft) {
          lVar2 = *plVar1 * uVar5 + lVar4;
          uVar3 = 0;
          do {
            *(double *)(lVar2 + uVar3 * 8) =
                 *(double *)(local_768[0] + uVar5 * 8) * *(double *)(lVar2 + uVar3 * 8);
            uVar3 = uVar3 + 1;
          } while (length != uVar3);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar6);
    }
  }
  cv::Mat::~Mat((Mat *)&local_778);
  cv::Mat::~Mat(local_7d8);
  cv::Mat::~Mat(&local_610.super_Mat);
  cv::Mat::~Mat(local_310);
  cv::Mat::~Mat(local_2b0);
  cv::Mat::~Mat((Mat *)local_838);
  cv::Mat::~Mat(&local_1f0.super_Mat);
  cv::Mat::~Mat(&local_550.super_Mat);
  return __return_storage_ptr__;
}

Assistant:

cv::Mat_<double> mel_spectrogram_create(int nps, int n_fft, int n_mels) {
    double f_max = nps / 2.0;
    double f_min = 0;
    int n_fft_2 = 1 + n_fft / 2;
    // Initialize the weights
    //auto weights = nc::zeros<double>(nc::uint32(n_mels), nc::uint32(n_fft_2));
    auto weights = cv::Mat_<double>(n_mels, n_fft_2, 0.0);
    // Center freqs of each FFT bin
    //auto fftfreqs_ = nc::linspace<double>(f_min, f_max, nc::uint32(n_fft_2), true);
    auto fftfreqs = cvlinspace(f_min, f_max, n_fft_2);

    // 'Center freqs' of mel bands - uniformly spaced between limits
    double min_mel = hz_to_mel(f_min, false);
    double max_mel = hz_to_mel(f_max, false);
    //auto mels_ = nc::linspace(min_mel, max_mel, nc::uint32(n_mels + 2));
    auto mels = cvlinspace(min_mel, max_mel, n_mels + 2);
    auto mel_f = mel_to_hz(mels, false);

    //auto fdiff_ = nc::diff(mel_f_); //沿着指定轴计算第N维的离散差值(后一个元素减去前一个元素)
    cv::Mat_<double> d1(1, mel_f.cols * mel_f.rows - 1, (double *) (mel_f.data) + 1);
    cv::Mat_<double> d2(1, mel_f.cols * mel_f.rows - 1, (double *) (mel_f.data));
    cv::Mat_<double> fdiff = d1 - d2;

    //auto ramps = nc::subtract.outer(mel_f, fftfreqs); //nc没有subtract.outer
    //nc::NdArray<double> ramps = nc::zeros<double>(mel_f.cols, fftfreqs.cols);
    auto ramps = cv::Mat_<double>(mel_f.cols, fftfreqs.cols);
    for (int i = 0; i < mel_f.cols; i++) {
        for (int j = 0; j < fftfreqs.cols; j++) {
            ramps(i, j) = mel_f(0, i) - fftfreqs(0, j);
        }
    }

    for (int i = 0; i < n_mels; i++) {
        // lower and upper slopes for all bins
        //auto ramps_1 = nc::NdArray<double>(1, ramps.cols);
        auto ramps_1 = cv::Mat_<double>(1, ramps.cols);
        for (int j = 0; j < ramps.cols; j++) {
            ramps_1(0, j) = ramps(i, j);
        }
        //auto ramps_2 = nc::NdArray<double>(1, ramps.cols);
        auto ramps_2 = cv::Mat_<double>(1, ramps.cols);
        for (int j = 0; j < ramps.cols; j++) {
            ramps_2(0, j) = ramps(i + 2, j);
        }
        cv::Mat_<double> lower = ramps_1 * -1 / fdiff(0, i);
        cv::Mat_<double> upper = ramps_2 / fdiff(0, i + 1);
        // .. then intersect them with each other and zero
        //auto weights_1 = nc::maximum(nc::zeros<double>(1, ramps.cols), nc::minimum(lower, upper));
        cv::Mat c1 = lower;//(cv::Mat_<double>(1,5) << 1,2,-3,4,-5);
        cv::Mat c2 = upper;
        cv::Mat weights_1 = cv::Mat_<double>(1, lower.cols);
        cv::min(c1, c2, weights_1);
        cv::max(weights_1, 0, weights_1);
        for (int j = 0; j < n_fft_2; j++) {
            weights(i, j) = weights_1.at<double_t>(0, j);
        }
    }

    // Slaney-style mel is scaled to be approx constant energy per channel
    auto enorm = cv::Mat_<double>(1, n_mels);
    for (int j = 0; j < n_mels; j++) {
        enorm(0, j) = 2.0 / (mel_f(0, j + 2) - mel_f(0, j));
    }
    for (int j = 0; j < n_mels; j++) {
        for (int k = 0; k < n_fft_2; k++) {
            weights(j, k) *= enorm(0, j);
        }
    }
    return weights;
}